

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicLibraryManager.cpp
# Opt level: O2

void __thiscall
CppUnit::DynamicLibraryManager::loadLibrary(DynamicLibraryManager *this,string *libraryName)

{
  LibraryHandle pvVar1;
  DynamicLibraryManagerException *this_00;
  string sStack_38;
  
  releaseLibrary(this);
  pvVar1 = doLoadLibrary(this,libraryName);
  this->m_libraryHandle = pvVar1;
  if (pvVar1 != (LibraryHandle)0x0) {
    return;
  }
  this_00 = (DynamicLibraryManagerException *)__cxa_allocate_exception(0x38);
  getLastErrorDetail_abi_cxx11_(&sStack_38,this);
  DynamicLibraryManagerException::DynamicLibraryManagerException
            (this_00,&this->m_libraryName,&sStack_38,loadingFailed);
  __cxa_throw(this_00,&DynamicLibraryManagerException::typeinfo,
              DynamicLibraryManagerException::~DynamicLibraryManagerException);
}

Assistant:

void
DynamicLibraryManager::loadLibrary( const std::string &libraryName )
{
  try
  {
    releaseLibrary();
    m_libraryHandle = doLoadLibrary( libraryName );
    if ( m_libraryHandle != NULL )
      return;
  }
  catch (...)
  {
  }

  throw DynamicLibraryManagerException( m_libraryName,
                                        getLastErrorDetail(),
                                        DynamicLibraryManagerException::loadingFailed );
}